

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_utils.h
# Opt level: O0

void recode_loop_update_q
               (AV1_COMP *cpi,int *loop,int *q,int *q_low,int *q_high,int top_index,int bottom_index
               ,int *undershoot_seen,int *overshoot_seen,int *low_cr_seen,int loop_count)

{
  aom_bit_depth_t aVar1;
  long lVar2;
  int iVar3;
  aom_bit_depth_t aVar4;
  int iVar5;
  int iVar6;
  aom_bit_depth_t aVar7;
  long lVar8;
  long lVar9;
  aom_bit_depth_t *in_RCX;
  aom_bit_depth_t *in_RDX;
  uint *in_RSI;
  AV1_COMP *in_RDI;
  aom_bit_depth_t *in_R8;
  aom_bit_depth_t in_R9D;
  int *in_stack_00000010;
  int *in_stack_00000018;
  int *in_stack_00000020;
  int in_stack_00000028;
  int q_regulated_1;
  int q_mid_1;
  int q_regulated;
  int q_mid;
  double q_val_high_new;
  double q_val_high_current;
  int64_t low_err_target;
  int64_t high_err_target;
  int64_t kf_err;
  int frame_under_shoot_limit;
  int frame_over_shoot_limit;
  int last_q;
  DECODER_MODEL_STATUS status;
  AV1_LEVEL target_level;
  DECODER_MODEL *decoder_models;
  AV1LevelInfo *level_info;
  AV1LevelParams *level_params;
  int projected_q;
  double cr_ratio;
  double target_cr;
  double compression_ratio;
  int min_cr;
  RateControlCfg *rc_cfg;
  PRIMARY_RATE_CONTROL *p_rc;
  RATE_CONTROL *rc;
  AV1_COMMON *cm;
  aom_bit_depth_t in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  int in_stack_fffffffffffffed8;
  AV1_COMP *pAVar10;
  undefined4 in_stack_fffffffffffffef4;
  aom_bit_depth_t local_108;
  aom_bit_depth_t local_104;
  aom_bit_depth_t local_100;
  aom_bit_depth_t local_fc;
  aom_bit_depth_t local_f8;
  int in_stack_ffffffffffffff0c;
  aom_bit_depth_t in_stack_ffffffffffffff10;
  aom_bit_depth_t in_stack_ffffffffffffff14;
  aom_bit_depth_t in_stack_ffffffffffffff18;
  aom_bit_depth_t in_stack_ffffffffffffff1c;
  aom_bit_depth_t in_stack_ffffffffffffff20;
  aom_bit_depth_t in_stack_ffffffffffffff24;
  int in_stack_ffffffffffffff34;
  DECODER_MODEL *in_stack_ffffffffffffff38;
  AV1_COMP *in_stack_ffffffffffffff40;
  AV1_COMP *in_stack_ffffffffffffff48;
  long local_a8;
  int local_a0;
  int local_9c;
  aom_bit_depth_t local_98;
  DECODER_MODEL_STATUS local_92;
  byte local_91;
  DECODER_MODEL *local_90;
  AV1LevelInfo *local_88;
  AV1LevelParams *local_80;
  aom_bit_depth_t local_74;
  double local_70;
  double local_68;
  double local_60;
  uint local_54;
  RateControlCfg *local_50;
  PRIMARY_RATE_CONTROL *local_48;
  RATE_CONTROL *local_40;
  AV1_COMMON *local_38;
  aom_bit_depth_t local_2c;
  aom_bit_depth_t *local_28;
  aom_bit_depth_t *local_20;
  aom_bit_depth_t *local_18;
  uint *local_10;
  AV1_COMP *local_8;
  
  local_38 = &in_RDI->common;
  local_40 = &in_RDI->rc;
  local_48 = &in_RDI->ppi->p_rc;
  local_50 = &(in_RDI->oxcf).rc_cfg;
  *in_RSI = 0;
  if (((in_RDI->rc).is_src_frame_alt_ref == 0) ||
     ((in_RDI->rc).max_frame_bandwidth <= (in_RDI->rc).projected_frame_size)) {
    local_54 = (in_RDI->oxcf).rc_cfg.min_cr;
    local_2c = in_R9D;
    local_28 = in_R8;
    local_20 = in_RCX;
    local_18 = in_RDX;
    local_10 = in_RSI;
    local_8 = in_RDI;
    if (0 < (int)local_54) {
      local_60 = av1_get_compression_ratio(local_38,(long)((in_RDI->rc).projected_frame_size >> 3));
      local_68 = (double)(int)local_54 / 100.0;
      if ((local_60 < local_68) &&
         (*in_stack_00000020 = 1, (int)*local_18 < local_40->worst_quality)) {
        local_70 = local_68 / local_60;
        if ((int)((double)(int)*local_18 * local_70 * local_70) < (int)(*local_18 + 1)) {
          in_stack_ffffffffffffff24 = *local_18 + 1;
        }
        else {
          in_stack_ffffffffffffff24 =
               (aom_bit_depth_t)((double)(int)*local_18 * local_70 * local_70);
        }
        in_stack_ffffffffffffff20 = in_stack_ffffffffffffff24;
        if ((int)(*local_18 + 0x20) <= (int)in_stack_ffffffffffffff24) {
          in_stack_ffffffffffffff20 = *local_18 + 0x20;
        }
        if ((int)in_stack_ffffffffffffff20 < local_40->worst_quality) {
          in_stack_ffffffffffffff18 = in_stack_ffffffffffffff24;
          in_stack_ffffffffffffff1c = in_stack_ffffffffffffff24;
          if ((int)(*local_18 + 0x20) <= (int)in_stack_ffffffffffffff24) {
            in_stack_ffffffffffffff18 = *local_18 + 0x20;
            in_stack_ffffffffffffff1c = *local_18 + 0x20;
          }
        }
        else {
          in_stack_ffffffffffffff18 = local_40->worst_quality;
        }
        *local_18 = in_stack_ffffffffffffff18;
        if ((int)*local_20 < (int)*local_18) {
          in_stack_ffffffffffffff14 = *local_18;
        }
        else {
          in_stack_ffffffffffffff14 = *local_20;
        }
        *local_20 = in_stack_ffffffffffffff14;
        if ((int)*local_28 < (int)*local_18) {
          in_stack_ffffffffffffff10 = *local_18;
        }
        else {
          in_stack_ffffffffffffff10 = *local_28;
        }
        *local_28 = in_stack_ffffffffffffff10;
        *local_10 = 1;
        local_74 = in_stack_ffffffffffffff24;
      }
      if (*in_stack_00000020 != 0) {
        return;
      }
    }
    if (((local_8->ppi->level_params).keep_level_stats != 0) &&
       (iVar3 = is_stat_generation_stage(local_8), iVar3 == 0)) {
      if (((local_38->current_frame).frame_type == '\0') &&
         ((local_8->ppi->gf_group).refbuf_state[local_8->gf_frame_index] == '\0')) {
        av1_init_level_info((AV1_COMP *)
                            CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      }
      local_80 = &local_8->ppi->level_params;
      local_88 = (local_8->ppi->level_params).level_info[0];
      local_90 = local_88->decoder_models;
      local_91 = local_80->target_seq_level_idx[0];
      if ((((local_91 < 0x1c) && (local_90[local_91].status == '\0')) &&
          ((local_92 = av1_decoder_model_try_smooth_buf
                                 (in_stack_ffffffffffffff48,(size_t)in_stack_ffffffffffffff40,
                                  in_stack_ffffffffffffff38), local_92 == '\x05' ||
           (local_92 == '\x06')))) && ((int)*local_18 < local_40->worst_quality)) {
        if ((int)(*local_18 + AOM_BITS_10) < local_40->worst_quality) {
          aVar4 = *local_18 + AOM_BITS_10;
        }
        else {
          aVar4 = local_40->worst_quality;
        }
        *local_18 = aVar4;
        if ((int)*local_20 < (int)*local_18) {
          local_f8 = *local_18;
        }
        else {
          local_f8 = *local_20;
        }
        *local_20 = local_f8;
        if ((int)*local_28 < (int)*local_18) {
          local_fc = *local_18;
        }
        else {
          local_fc = *local_28;
        }
        *local_28 = local_fc;
        *local_10 = 1;
        return;
      }
    }
    if (local_50->mode != AOM_Q) {
      local_98 = *local_18;
      local_9c = 0;
      local_a0 = 0;
      av1_rc_compute_frame_size_bounds(local_8,local_40->this_frame_target,&local_a0,&local_9c);
      if (local_9c == 0) {
        local_9c = 1;
      }
      if ((((local_38->current_frame).frame_type == '\0') && (local_48->this_key_frame_forced != 0))
         && (local_40->projected_frame_size < local_40->max_frame_bandwidth)) {
        lVar2 = local_8->ambient_err;
        lVar8 = local_8->ambient_err >> 1;
        if (local_38->seq_params->use_highbitdepth == '\0') {
          local_a8 = aom_get_y_sse((YV12_BUFFER_CONFIG *)
                                   CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                                   (YV12_BUFFER_CONFIG *)
                                   CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        }
        else {
          local_a8 = aom_highbd_get_y_sse
                               ((YV12_BUFFER_CONFIG *)
                                CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                                (YV12_BUFFER_CONFIG *)
                                CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        }
        lVar9 = (int)(uint)((local_a8 != 0 ^ 0xffU) & 1) + local_a8;
        if (((lVar2 < lVar9) && (local_40->projected_frame_size <= local_9c)) ||
           ((lVar8 < lVar9 && (local_40->projected_frame_size <= local_a0)))) {
          if ((int)*local_20 < (int)(*local_18 - 1)) {
            local_100 = *local_18 - 1;
          }
          else {
            local_100 = *local_20;
          }
          *local_28 = local_100;
          *local_18 = (aom_bit_depth_t)(((int)*local_18 * lVar2) / lVar9);
          if ((int)*local_18 < (int)(*local_28 + *local_20) >> 1) {
            local_104 = *local_18;
          }
          else {
            local_104 = (int)(*local_28 + *local_20) >> 1;
          }
          *local_18 = local_104;
        }
        else if ((lVar9 < lVar8) && (local_a0 <= local_40->projected_frame_size)) {
          if ((int)(*local_18 + 1) < (int)*local_28) {
            local_108 = *local_18 + 1;
          }
          else {
            local_108 = *local_28;
          }
          *local_20 = local_108;
          *local_18 = (aom_bit_depth_t)(((int)*local_18 * lVar8) / lVar9);
          if ((int)*local_18 < (int)(*local_28 + *local_20 + 1) >> 1) {
            aVar4 = *local_18;
          }
          else {
            aVar4 = (int)(*local_28 + *local_20 + 1) >> 1;
          }
          *local_18 = aVar4;
        }
        aVar4 = clamp(*local_18,*local_20,*local_28);
        *local_18 = aVar4;
        *local_10 = (uint)(*local_18 != local_98);
      }
      else {
        aVar4 = *local_18;
        aVar7 = local_2c;
        if ((int)local_2c < (int)*local_28) {
          aVar7 = *local_28;
        }
        iVar3 = local_9c;
        iVar6 = local_a0;
        iVar5 = recode_loop_test((AV1_COMP *)CONCAT44(in_stack_fffffffffffffef4,aVar4),local_a0,
                                 local_9c,(int)((ulong)local_8 >> 0x20),(int)local_8,aVar7);
        if (iVar5 != 0) {
          if (local_40->this_frame_target < local_40->projected_frame_size) {
            if ((*local_18 == *local_28) &&
               (local_40->max_frame_bandwidth <= local_40->projected_frame_size)) {
              in_stack_ffffffffffffff40 =
                   (AV1_COMP *)
                   av1_convert_qindex_to_q(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8);
              in_stack_ffffffffffffff38 =
                   (DECODER_MODEL *)
                   ((double)in_stack_ffffffffffffff40 *
                   ((double)local_40->projected_frame_size / (double)local_40->max_frame_bandwidth))
              ;
              aVar4 = av1_find_qindex((double)local_8,aVar7,in_stack_fffffffffffffed8,
                                      in_stack_fffffffffffffed4);
              *local_28 = aVar4;
            }
            if ((int)(*local_18 + 1) < (int)*local_28) {
              aVar4 = *local_18 + 1;
            }
            else {
              aVar4 = *local_28;
            }
            *local_20 = aVar4;
            if (((*in_stack_00000010 == 0) && (in_stack_00000028 < 3)) &&
               ((in_stack_00000028 != 2 || (iVar3 = frame_is_intra_only(local_38), iVar3 != 0)))) {
              if ((in_stack_00000028 == 2) && (iVar3 = frame_is_intra_only(local_38), iVar3 != 0)) {
                iVar3 = (int)(*local_28 + *local_20 + 1) / 2;
                iVar6 = get_regulated_q_overshoot
                                  ((AV1_COMP *)
                                   CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                                   in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18,
                                   in_stack_ffffffffffffff14,in_stack_ffffffffffffff10,
                                   in_stack_ffffffffffffff0c);
                *local_18 = (iVar3 + iVar6 + 1) / 2;
              }
              else {
                aVar4 = get_regulated_q_overshoot
                                  ((AV1_COMP *)
                                   CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                                   in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18,
                                   in_stack_ffffffffffffff14,in_stack_ffffffffffffff10,
                                   in_stack_ffffffffffffff0c);
                *local_18 = aVar4;
              }
            }
            else {
              av1_rc_update_rate_correction_factors
                        (in_stack_ffffffffffffff40,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
                         (int)in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
              *local_18 = (int)(*local_28 + *local_20 + 1) / 2;
            }
            *in_stack_00000018 = 1;
          }
          else {
            if ((int)*local_20 < (int)(*local_18 - 1)) {
              aVar7 = *local_18 - 1;
            }
            else {
              aVar7 = *local_20;
            }
            *local_28 = aVar7;
            if (((*in_stack_00000018 == 0) && (in_stack_00000028 < 3)) &&
               ((pAVar10 = local_8, in_stack_00000028 != 2 ||
                (iVar5 = frame_is_intra_only(local_38), pAVar10 = local_8, iVar5 != 0)))) {
              if ((in_stack_00000028 == 2) && (iVar5 = frame_is_intra_only(local_38), iVar5 != 0)) {
                aVar7 = *local_28;
                aVar1 = *local_20;
                iVar3 = get_regulated_q_undershoot
                                  ((AV1_COMP *)CONCAT44(in_stack_fffffffffffffef4,aVar4),iVar6,iVar3
                                   ,(int)((ulong)pAVar10 >> 0x20),(int)pAVar10);
                *local_18 = ((int)(aVar7 + aVar1) / 2 + iVar3) / 2;
                if ((local_50->mode == AOM_CQ) && (iVar3 < (int)*local_20)) {
                  *local_20 = *local_18;
                }
              }
              else {
                aVar4 = get_regulated_q_undershoot
                                  ((AV1_COMP *)CONCAT44(in_stack_fffffffffffffef4,aVar4),iVar6,iVar3
                                   ,(int)((ulong)pAVar10 >> 0x20),(int)pAVar10);
                *local_18 = aVar4;
                if ((local_50->mode == AOM_CQ) && ((int)*local_18 < (int)*local_20)) {
                  *local_20 = *local_18;
                }
              }
            }
            else {
              av1_rc_update_rate_correction_factors
                        (in_stack_ffffffffffffff40,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
                         (int)in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
              *local_18 = (int)(*local_28 + *local_20) / 2;
            }
            *in_stack_00000010 = 1;
          }
          aVar4 = clamp(*local_18,*local_20,*local_28);
          *local_18 = aVar4;
        }
        *local_10 = (uint)(*local_18 != local_98);
      }
    }
  }
  return;
}

Assistant:

static inline void recode_loop_update_q(
    AV1_COMP *const cpi, int *const loop, int *const q, int *const q_low,
    int *const q_high, const int top_index, const int bottom_index,
    int *const undershoot_seen, int *const overshoot_seen,
    int *const low_cr_seen, const int loop_count) {
  AV1_COMMON *const cm = &cpi->common;
  RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  const RateControlCfg *const rc_cfg = &cpi->oxcf.rc_cfg;
  *loop = 0;

  // Special case for overlay frame.
  if (rc->is_src_frame_alt_ref &&
      rc->projected_frame_size < rc->max_frame_bandwidth)
    return;

  const int min_cr = rc_cfg->min_cr;
  if (min_cr > 0) {
    const double compression_ratio =
        av1_get_compression_ratio(cm, rc->projected_frame_size >> 3);
    const double target_cr = min_cr / 100.0;
    if (compression_ratio < target_cr) {
      *low_cr_seen = 1;
      if (*q < rc->worst_quality) {
        const double cr_ratio = target_cr / compression_ratio;
        const int projected_q = AOMMAX(*q + 1, (int)(*q * cr_ratio * cr_ratio));
        *q = AOMMIN(AOMMIN(projected_q, *q + 32), rc->worst_quality);
        *q_low = AOMMAX(*q, *q_low);
        *q_high = AOMMAX(*q, *q_high);
        *loop = 1;
      }
    }
    if (*low_cr_seen) return;
  }

  if (cpi->ppi->level_params.keep_level_stats &&
      !is_stat_generation_stage(cpi)) {
    // Initialize level info. at the beginning of each sequence.
    if (cm->current_frame.frame_type == KEY_FRAME &&
        cpi->ppi->gf_group.refbuf_state[cpi->gf_frame_index] == REFBUF_RESET) {
      av1_init_level_info(cpi);
    }
    const AV1LevelParams *const level_params = &cpi->ppi->level_params;
    // TODO(any): currently only checking operating point 0
    const AV1LevelInfo *const level_info = level_params->level_info[0];
    const DECODER_MODEL *const decoder_models = level_info->decoder_models;
    const AV1_LEVEL target_level = level_params->target_seq_level_idx[0];

    if (target_level < SEQ_LEVELS &&
        decoder_models[target_level].status == DECODER_MODEL_OK) {
      DECODER_MODEL_STATUS status = av1_decoder_model_try_smooth_buf(
          cpi, rc->projected_frame_size, &decoder_models[target_level]);

      if ((status == SMOOTHING_BUFFER_UNDERFLOW ||
           status == SMOOTHING_BUFFER_OVERFLOW) &&
          *q < rc->worst_quality) {
        *q = AOMMIN(*q + 10, rc->worst_quality);
        *q_low = AOMMAX(*q, *q_low);
        *q_high = AOMMAX(*q, *q_high);
        *loop = 1;
        return;
      }
    }
  }

  if (rc_cfg->mode == AOM_Q) return;

  const int last_q = *q;
  int frame_over_shoot_limit = 0, frame_under_shoot_limit = 0;
  av1_rc_compute_frame_size_bounds(cpi, rc->this_frame_target,
                                   &frame_under_shoot_limit,
                                   &frame_over_shoot_limit);
  if (frame_over_shoot_limit == 0) frame_over_shoot_limit = 1;

  if (cm->current_frame.frame_type == KEY_FRAME &&
      p_rc->this_key_frame_forced &&
      rc->projected_frame_size < rc->max_frame_bandwidth) {
    int64_t kf_err;
    const int64_t high_err_target = cpi->ambient_err;
    const int64_t low_err_target = cpi->ambient_err >> 1;

#if CONFIG_AV1_HIGHBITDEPTH
    if (cm->seq_params->use_highbitdepth) {
      kf_err = aom_highbd_get_y_sse(cpi->source, &cm->cur_frame->buf);
    } else {
      kf_err = aom_get_y_sse(cpi->source, &cm->cur_frame->buf);
    }
#else
    kf_err = aom_get_y_sse(cpi->source, &cm->cur_frame->buf);
#endif
    // Prevent possible divide by zero error below for perfect KF
    kf_err += !kf_err;

    // The key frame is not good enough or we can afford
    // to make it better without undue risk of popping.
    if ((kf_err > high_err_target &&
         rc->projected_frame_size <= frame_over_shoot_limit) ||
        (kf_err > low_err_target &&
         rc->projected_frame_size <= frame_under_shoot_limit)) {
      // Lower q_high
      *q_high = AOMMAX(*q - 1, *q_low);

      // Adjust Q
      *q = (int)((*q * high_err_target) / kf_err);
      *q = AOMMIN(*q, (*q_high + *q_low) >> 1);
    } else if (kf_err < low_err_target &&
               rc->projected_frame_size >= frame_under_shoot_limit) {
      // The key frame is much better than the previous frame
      // Raise q_low
      *q_low = AOMMIN(*q + 1, *q_high);

      // Adjust Q
      *q = (int)((*q * low_err_target) / kf_err);
      *q = AOMMIN(*q, (*q_high + *q_low + 1) >> 1);
    }

    // Clamp Q to upper and lower limits:
    *q = clamp(*q, *q_low, *q_high);
    *loop = (*q != last_q);
    return;
  }

  if (recode_loop_test(cpi, frame_over_shoot_limit, frame_under_shoot_limit, *q,
                       AOMMAX(*q_high, top_index), bottom_index)) {
    // Is the projected frame size out of range and are we allowed
    // to attempt to recode.

    // Frame size out of permitted range:
    // Update correction factor & compute new Q to try...
    // Frame is too large
    if (rc->projected_frame_size > rc->this_frame_target) {
      // Special case if the projected size is > the max allowed.
      if (*q == *q_high &&
          rc->projected_frame_size >= rc->max_frame_bandwidth) {
        const double q_val_high_current =
            av1_convert_qindex_to_q(*q_high, cm->seq_params->bit_depth);
        const double q_val_high_new =
            q_val_high_current *
            ((double)rc->projected_frame_size / rc->max_frame_bandwidth);
        *q_high = av1_find_qindex(q_val_high_new, cm->seq_params->bit_depth,
                                  rc->best_quality, rc->worst_quality);
      }

      // Raise Qlow as to at least the current value
      *q_low = AOMMIN(*q + 1, *q_high);

      if (*undershoot_seen || loop_count > 2 ||
          (loop_count == 2 && !frame_is_intra_only(cm))) {
        av1_rc_update_rate_correction_factors(cpi, 1, cm->width, cm->height);

        *q = (*q_high + *q_low + 1) / 2;
      } else if (loop_count == 2 && frame_is_intra_only(cm)) {
        const int q_mid = (*q_high + *q_low + 1) / 2;
        const int q_regulated = get_regulated_q_overshoot(
            cpi, 1, *q_low, *q_high, top_index, bottom_index);
        // Get 'q' in-between 'q_mid' and 'q_regulated' for a smooth
        // transition between loop_count < 2 and loop_count > 2.
        *q = (q_mid + q_regulated + 1) / 2;
      } else {
        *q = get_regulated_q_overshoot(cpi, 1, *q_low, *q_high, top_index,
                                       bottom_index);
      }

      *overshoot_seen = 1;
    } else {
      // Frame is too small
      *q_high = AOMMAX(*q - 1, *q_low);

      if (*overshoot_seen || loop_count > 2 ||
          (loop_count == 2 && !frame_is_intra_only(cm))) {
        av1_rc_update_rate_correction_factors(cpi, 1, cm->width, cm->height);
        *q = (*q_high + *q_low) / 2;
      } else if (loop_count == 2 && frame_is_intra_only(cm)) {
        const int q_mid = (*q_high + *q_low) / 2;
        const int q_regulated = get_regulated_q_undershoot(
            cpi, 1, *q_high, top_index, bottom_index);
        // Get 'q' in-between 'q_mid' and 'q_regulated' for a smooth
        // transition between loop_count < 2 and loop_count > 2.
        *q = (q_mid + q_regulated) / 2;

        // Special case reset for qlow for constrained quality.
        // This should only trigger where there is very substantial
        // undershoot on a frame and the auto cq level is above
        // the user passsed in value.
        if (rc_cfg->mode == AOM_CQ && q_regulated < *q_low) {
          *q_low = *q;
        }
      } else {
        *q = get_regulated_q_undershoot(cpi, 1, *q_high, top_index,
                                        bottom_index);

        // Special case reset for qlow for constrained quality.
        // This should only trigger where there is very substantial
        // undershoot on a frame and the auto cq level is above
        // the user passsed in value.
        if (rc_cfg->mode == AOM_CQ && *q < *q_low) {
          *q_low = *q;
        }
      }

      *undershoot_seen = 1;
    }

    // Clamp Q to upper and lower limits:
    *q = clamp(*q, *q_low, *q_high);
  }

  *loop = (*q != last_q);
}